

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O1

int __thiscall sptk::reaper::FFT::makefttable(FFT *this,int pow2)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  iVar3 = 1 << ((byte)pow2 & 0x1f);
  this->fftSize = iVar3;
  iVar6 = iVar3 / 2;
  this->fft_ftablesize = iVar6;
  uVar5 = 0xffffffffffffffff;
  if (pow2 != 0x1f) {
    uVar5 = (long)iVar6 << 2;
  }
  pfVar1 = (float *)operator_new__(uVar5);
  this->fsine = pfVar1;
  pfVar2 = (float *)operator_new__(uVar5);
  this->fcosine = pfVar2;
  if (1 < iVar3) {
    dVar9 = 0.0;
    lVar4 = 0;
    do {
      dVar7 = (6.283185307179586 / (double)iVar3) * dVar9;
      dVar8 = sin(dVar7);
      pfVar1[lVar4] = (float)dVar8;
      dVar7 = cos(dVar7);
      pfVar2[lVar4] = (float)dVar7;
      dVar9 = dVar9 + 1.0;
      lVar4 = lVar4 + 1;
    } while (iVar6 != (int)lVar4);
  }
  this->kbase = (this->fft_ftablesize * 2) / this->fftSize;
  this->power2 = pow2;
  return this->fft_ftablesize;
}

Assistant:

int FFT::makefttable(int pow2) {
  int lmx, lm;
  float *c, *s;
  double scl, arg;

  fftSize = 1 << pow2;
  fft_ftablesize = lmx = fftSize/2;
  fsine = new float[lmx];
  fcosine = new float[lmx];
  scl = (M_PI * 2.0) / fftSize;
  for (s = fsine, c = fcosine, lm = 0; lm < lmx; ++lm) {
    arg = scl * lm;
    *s++ = sin(arg);
    *c++ = cos(arg);
  }
  kbase = (fft_ftablesize * 2) / fftSize;
  power2 = pow2;
  return(fft_ftablesize);
}